

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O1

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator%=(ZZ<130UL> *this,word wRight)

{
  word *pwVar1;
  word wVar2;
  word wVar3;
  size_t pos;
  long lVar4;
  bool bVar5;
  
  lVar4 = 2;
  wVar3 = 0;
  do {
    wVar2 = (this->super_WW<130UL>)._words[lVar4];
    wVar3 = __udivti3(wVar2,wVar3,wRight,0);
    (this->super_WW<130UL>)._words[lVar4] = wVar3;
    wVar3 = wVar2 - wVar3 * wRight;
    bVar5 = lVar4 != 0;
    lVar4 = lVar4 + -1;
  } while (bVar5);
  (this->super_WW<130UL>)._words[0] = wVar3;
  (this->super_WW<130UL>)._words[1] = 0;
  (this->super_WW<130UL>)._words[2] = 0;
  pwVar1 = (this->super_WW<130UL>)._words + 2;
  *pwVar1 = *pwVar1 & 3;
  return this;
}

Assistant:

ZZ& operator%=(word wRight)
	{	
		Div(wRight);
		return operator=(wRight);
	}